

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDocument.cpp
# Opt level: O3

string * __thiscall
iDynTree::XMLDocument::description_abi_cxx11_(string *__return_storage_ptr__,XMLDocument *this)

{
  XMLElement *this_00;
  ostringstream str;
  string local_1a8;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  this_00 = (((this->m_pimpl)._M_t.
              super___uniq_ptr_impl<iDynTree::XMLDocument::XMLDocumentPimpl,_std::default_delete<iDynTree::XMLDocument::XMLDocumentPimpl>_>
              ._M_t.
              super__Tuple_impl<0UL,_iDynTree::XMLDocument::XMLDocumentPimpl_*,_std::default_delete<iDynTree::XMLDocument::XMLDocumentPimpl>_>
              .super__Head_base<0UL,_iDynTree::XMLDocument::XMLDocumentPimpl_*,_false>._M_head_impl)
            ->m_root).super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (XMLElement *)0x0) {
    XMLElement::description_abi_cxx11_(&local_1a8,this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string XMLDocument::description() const
    {
        std::ostringstream str;
        if (m_pimpl->m_root) {
            str << m_pimpl->m_root->description();
        }
        return str.str();
    }